

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# General.cc
# Opt level: O2

void __thiscall
General_copyAssignable_Test::~General_copyAssignable_Test(General_copyAssignable_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(General, copyAssignable)
{
  sigs::Signal<void()> s;
  s.connect([] {});
  s.connect([] {});
  s.setBlocked(true);

  decltype(s) s2;
  s2 = s;
  ASSERT_EQ(s2.size(), 2);
  ASSERT_TRUE(s2.blocked());
}